

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O2

void __thiscall TriangleMesh::TriangleMesh(TriangleMesh *this,string *filename)

{
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_70;
  string local_58;
  string local_38;
  
  (this->super_BasicContainer).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001605a8;
  std::__cxx11::string::string((string *)&local_38,(string *)filename);
  getpath(&local_58,&local_38);
  loadfromfile((vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_70,this,
               local_58._M_dataplus._M_p);
  BasicContainer::BasicContainer
            (&this->super_BasicContainer,
             (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_70);
  std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_70);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_BasicContainer).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_001605a8;
  return;
}

Assistant:

TriangleMesh(std::string filename):
		BasicContainer(loadfromfile(getpath(filename).c_str())) {}